

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::CreateEvaluationSourceFiles(cmGlobalGenerator *this,string *config)

{
  pointer ppcVar1;
  
  for (ppcVar1 = (this->EvaluationFiles).
                 super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppcVar1 !=
      (this->EvaluationFiles).
      super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppcVar1 = ppcVar1 + 1) {
    cmGeneratorExpressionEvaluationFile::CreateOutputFile(*ppcVar1,config);
  }
  return;
}

Assistant:

void cmGlobalGenerator::CreateEvaluationSourceFiles(
                                              std::string const& config) const
{
  for(std::vector<cmGeneratorExpressionEvaluationFile*>::const_iterator
      li = this->EvaluationFiles.begin();
      li != this->EvaluationFiles.end();
      ++li)
    {
    (*li)->CreateOutputFile(config);
    }
}